

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> * __thiscall
kj::_::ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
          (ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this,
          ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *param_1)

{
  ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *param_1_local;
  ExceptionOr<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
            (&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;